

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManchesterAnalyzer.cpp
# Opt level: O3

void __thiscall ManchesterAnalyzer::SynchronizeManchester(ManchesterAnalyzer *this)

{
  pointer puVar1;
  bool bVar2;
  U32 UVar3;
  iterator iVar4;
  pointer ppVar5;
  unsigned_long_long *puVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  pointer puVar10;
  pointer puVar11;
  U32 UVar12;
  ulong uVar13;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> locations_to_save;
  U64 edge_location;
  unsigned_long_long *local_48;
  iterator iStack_40;
  unsigned_long_long *local_38;
  unsigned_long_long local_28;
  
  if (this->mSynchronized == false) {
    do {
      Analyzer::CheckIfThreadShouldExit();
      local_28 = AnalyzerChannelData::GetSampleNumber();
      AnalyzerChannelData::AdvanceToNextEdge();
      lVar8 = AnalyzerChannelData::GetSampleNumber();
      uVar9 = lVar8 - local_28;
      UVar12 = this->mT;
      UVar3 = this->mTError;
      if (uVar9 < UVar3 + UVar12 && UVar12 - UVar3 < uVar9) {
        iVar4._M_current =
             (this->mUnsyncedLocations).
             super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (this->mUnsyncedLocations).
            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>::
          _M_realloc_insert<unsigned_long_long_const&>
                    ((vector<unsigned_long_long,std::allocator<unsigned_long_long>> *)
                     &this->mUnsyncedLocations,iVar4,&local_28);
        }
        else {
          *iVar4._M_current = local_28;
          (this->mUnsyncedLocations).
          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
      }
      else {
        if (uVar9 < UVar3 + UVar12 * 2 && UVar12 * 2 - UVar3 < uVar9) {
          iVar4._M_current =
               (this->mUnsyncedLocations).
               super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (this->mUnsyncedLocations).
              super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>::
            _M_realloc_insert<unsigned_long_long_const&>
                      ((vector<unsigned_long_long,std::allocator<unsigned_long_long>> *)
                       &this->mUnsyncedLocations,iVar4,&local_28);
          }
          else {
            *iVar4._M_current = local_28;
            (this->mUnsyncedLocations).
            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar4._M_current + 1;
          }
          this->mSynchronized = true;
          iVar7 = AnalyzerChannelData::GetBitState();
          bVar2 = ((this->mSettings)._M_ptr)->mInverted;
          UVar12 = 1;
          if (((iVar7 == 0 & bVar2) == 0) && (UVar12 = 0, (iVar7 == 1 & bVar2) == 0)) {
            UVar12 = (U32)(bVar2 == false && iVar7 == 1);
          }
          local_48 = (unsigned_long_long *)0x0;
          iStack_40._M_current = (unsigned_long_long *)0x0;
          local_38 = (unsigned_long_long *)0x0;
          puVar10 = (this->mUnsyncedLocations).
                    super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          puVar11 = (this->mUnsyncedLocations).
                    super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          if (puVar11 != puVar10) {
            do {
              if (iStack_40._M_current == local_38) {
                std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>::
                _M_realloc_insert<unsigned_long_long_const&>
                          ((vector<unsigned_long_long,std::allocator<unsigned_long_long>> *)
                           &local_48,iStack_40,puVar11 + -1);
                puVar10 = (this->mUnsyncedLocations).
                          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                puVar11 = (this->mUnsyncedLocations).
                          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              }
              else {
                *iStack_40._M_current = puVar11[-1];
                iStack_40._M_current = iStack_40._M_current + 1;
              }
              iVar4._M_current = iStack_40._M_current;
              puVar6 = local_48;
              puVar1 = puVar11 + -1;
              puVar11 = puVar11 + -2;
              if (puVar1 == puVar10) {
                puVar11 = puVar1;
              }
              (this->mUnsyncedLocations).
              super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
              super__Vector_impl_data._M_finish = puVar11;
            } while (puVar11 != puVar10);
            if (local_48 != iStack_40._M_current) {
              uVar9 = (long)iStack_40._M_current - (long)local_48 >> 3;
              lVar8 = 0x3f;
              if (uVar9 != 0) {
                for (; uVar9 >> lVar8 == 0; lVar8 = lVar8 + -1) {
                }
              }
              std::
              __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long_long*,std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                        (local_48,iStack_40._M_current,((uint)lVar8 ^ 0x3f) * 2 ^ 0x7e);
              std::
              __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long_long*,std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                        (puVar6,iVar4._M_current);
            }
          }
          uVar9 = (ulong)((long)iStack_40._M_current - (long)local_48) >> 3;
          if ((int)uVar9 != 0) {
            uVar13 = 0;
            do {
              SaveBit(this,local_48[uVar13],UVar12);
              uVar13 = uVar13 + 1;
            } while ((uVar9 & 0xffffffff) != uVar13);
          }
          if (local_48 == (unsigned_long_long *)0x0) {
            return;
          }
          operator_delete(local_48);
          return;
        }
        this->mSynchronized = false;
        ppVar5 = (this->mBitsForNextByte).
                 super__Vector_base<std::pair<unsigned_long_long,_unsigned_long_long>,_std::allocator<std::pair<unsigned_long_long,_unsigned_long_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((this->mBitsForNextByte).
            super__Vector_base<std::pair<unsigned_long_long,_unsigned_long_long>,_std::allocator<std::pair<unsigned_long_long,_unsigned_long_long>_>_>
            ._M_impl.super__Vector_impl_data._M_finish != ppVar5) {
          (this->mBitsForNextByte).
          super__Vector_base<std::pair<unsigned_long_long,_unsigned_long_long>,_std::allocator<std::pair<unsigned_long_long,_unsigned_long_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = ppVar5;
        }
        puVar11 = (this->mUnsyncedLocations).
                  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if ((this->mUnsyncedLocations).
            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
            super__Vector_impl_data._M_finish != puVar11) {
          (this->mUnsyncedLocations).
          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
          super__Vector_impl_data._M_finish = puVar11;
        }
        this->mIgnoreBitCount = ((this->mSettings)._M_ptr)->mBitsToIgnore;
      }
    } while (this->mSynchronized == false);
  }
  return;
}

Assistant:

void ManchesterAnalyzer::SynchronizeManchester()
{
    // we should already be on an edge, the first one out of idle.
    while( mSynchronized == false )
    {
        CheckIfThreadShouldExit();
        U64 edge_location = mManchester->GetSampleNumber();
        mManchester->AdvanceToNextEdge();
        U64 next_edge_location = mManchester->GetSampleNumber();
        U64 edge_distance = next_edge_location - edge_location;
        if( ( edge_distance > ( mT - mTError ) ) && ( edge_distance < ( mT + mTError ) ) ) // short
        {
            mUnsyncedLocations.push_back( edge_location );
        }
        else if( ( edge_distance > ( ( 2 * mT ) - mTError ) ) && ( edge_distance < ( ( 2 * mT ) + mTError ) ) ) // long
        {
            mUnsyncedLocations.push_back( edge_location );
            mSynchronized = true;
            BitState current_bit_state = mManchester->GetBitState();
            bool inverted = mSettings->mInverted;
            U32 bit_value = 0;
            if( ( inverted == true ) && ( current_bit_state == BIT_LOW ) ) // we are on a neg edge with inverted true
                bit_value = 1;                                             // the old marker will be the opposite of the current value.
            else if( ( inverted == true ) && ( current_bit_state == BIT_HIGH ) )
                bit_value = 0;
            else if( ( inverted == false ) && ( current_bit_state == BIT_LOW ) ) // we are on a neg edge with inverted false
                bit_value = 0;
            else if( ( inverted == false ) && ( current_bit_state == BIT_HIGH ) )
                bit_value = 1;
            std::vector<U64> locations_to_save;
            while( mUnsyncedLocations.size() > 0 )
            {
                locations_to_save.push_back( mUnsyncedLocations.back() );
                mUnsyncedLocations.pop_back();
                if( mUnsyncedLocations.size() > 0 )
                    mUnsyncedLocations.pop_back();
            }
            std::sort( locations_to_save.begin(), locations_to_save.end() );
            U32 count = locations_to_save.size();
            for( U32 i = 0; i < count; ++i )
                SaveBit( locations_to_save[ i ], bit_value );
            break;
        }
        else
        {
            // back to idle.
            Invalidate();
        }
    }
}